

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O1

void __thiscall Clasp::ScoreLook::scoreLits(ScoreLook *this,Solver *s,Literal *b,Literal *e)

{
  pointer pVVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint lhs;
  VarType VVar5;
  Literal *pLVar6;
  uint uVar7;
  uint uVar8;
  uint sc;
  bool bVar9;
  Var v;
  uint local_3c;
  VarVec *local_38;
  
  if (this->nant == false) {
    sc = (uint)((ulong)((long)e - (long)b) >> 2);
  }
  else if (b == e) {
    sc = 1;
  }
  else {
    sc = 1;
    pLVar6 = b;
    do {
      uVar8 = pLVar6->rep_ >> 2;
      uVar7 = 0;
      if (uVar8 < (s->shared_->varInfo_).ebo_.size) {
        uVar7 = (s->shared_->varInfo_).ebo_.buf[uVar8].rep >> 5 & 1;
      }
      sc = sc + uVar7;
      pLVar6 = pLVar6 + 1;
    } while (pLVar6 != e);
  }
  uVar7 = b->rep_;
  lhs = uVar7 >> 2;
  uVar8 = 0x3fff;
  if (sc < 0x3fff) {
    uVar8 = sc;
  }
  bVar9 = (uVar7 & 2) == 0;
  uVar2 = uVar8 << 0xe;
  uVar3 = 0xf0003fff;
  if (bVar9) {
    uVar2 = uVar8;
    uVar3 = 0xffffc000;
  }
  uVar8 = 0x80000000;
  if (bVar9) {
    uVar8 = 0x40000000;
  }
  pVVar1 = (this->score).ebo_.buf;
  *(uint *)(&pVVar1->field_0x0 + (uVar7 & 0xfffffffc)) =
       uVar8 | uVar2 | uVar3 & *(uint *)(&pVVar1->field_0x0 + (uVar7 & 0xfffffffc));
  if (this->addDeps == true) {
    if (((0xbfffffff < (uint)(this->score).ebo_.buf[lhs]) || (this->mode == score_max)) &&
       (local_3c = lhs, bVar9 = greater(this,lhs,this->best), bVar9)) {
      this->best = lhs;
    }
    if (b != e) {
      local_38 = &this->deps;
      do {
        local_3c = b->rep_ >> 2;
        if (local_3c < (this->score).ebo_.size) {
          if (local_3c < (s->shared_->varInfo_).ebo_.size) {
            bVar4 = (s->shared_->varInfo_).ebo_.buf[local_3c].rep;
          }
          else {
            bVar4 = 0;
          }
          VVar5 = Body - ((bVar4 & 8) == 0);
          if ((bVar4 & 0x10) != 0) {
            VVar5 = Hybrid;
          }
          if ((this->types & VVar5) != 0) {
            if (((this->score).ebo_.buf[local_3c].field_0x3 & 0x30) == 0) {
              bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (local_38,&local_3c);
            }
            VarScore::setDepScore((this->score).ebo_.buf + local_3c,(Literal)b->rep_,sc);
            pVVar1 = (this->score).ebo_.buf + local_3c;
            *pVVar1 = (VarScore)((uint)*pVVar1 | (b->rep_ & 2) * 0x8000000 + 0x10000000);
          }
        }
        b = b + 1;
      } while (b != e);
    }
  }
  return;
}

Assistant:

void ScoreLook::scoreLits(const Solver& s, const Literal* b, const Literal *e) {
	assert(b < e);
	uint32 sc = !nant ? uint32(e-b) : countNant(s, b, e);
	Var v     = b->var();
	assert(validVar(v));
	score[v].setScore(*b, sc);
	if (addDeps) {
		if ((score[v].testedBoth() || mode == score_max) && greater(v, best)) {
			best = v;
		}
		for (; b != e; ++b) {
			v = b->var();
			if (validVar(v) && (s.varInfo(v).type() & types) != 0) {
				if (!score[v].seen()) { deps.push_back(v); }
				score[v].setDepScore(*b, sc);
				score[v].setSeen(*b);
			}
		}
	}
}